

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O3

ostream * operator<<(ostream *out,RangeValue *shape)

{
  long *local_38;
  long local_30;
  long local_28 [2];
  
  if (shape->_isUnbound == true) {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"inf","");
    std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_38,local_30);
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
  }
  else {
    CoreML::RangeValue::value(shape);
    std::ostream::_M_insert<unsigned_long>((ulong)out);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const RangeValue& shape) {
    if (shape.isUnbound()) {
        out << std::string("inf");
    }
    else {
        out << shape.value();
    }
    return out;
}